

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O2

sunindextype
SUNDlsMat_bandGBTRF(sunrealtype **a,sunindextype n,sunindextype mu,sunindextype ml,sunindextype smu,
                   sunindextype *p)

{
  long lVar1;
  double *pdVar2;
  sunrealtype *psVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  sunindextype sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  
  if (mu < smu) {
    lVar5 = 0;
    lVar6 = 0;
    if (0 < n) {
      lVar6 = n;
    }
    for (; lVar5 != lVar6; lVar5 = lVar5 + 1) {
      psVar3 = a[lVar5];
      for (lVar12 = 0; smu - mu != lVar12; lVar12 = lVar12 + 1) {
        psVar3[lVar12] = 0.0;
      }
    }
  }
  lVar5 = n + -1;
  lVar6 = 0;
  if (0 < lVar5) {
    lVar6 = lVar5;
  }
  lVar12 = 0;
  while( true ) {
    if (lVar12 == lVar6) {
      *p = lVar5;
      sVar11 = n;
      if (a[n + -1][smu] != 0.0) {
        sVar11 = 0;
      }
      if (NAN(a[n + -1][smu])) {
        sVar11 = 0;
      }
      return sVar11;
    }
    psVar3 = a[lVar12];
    pdVar2 = psVar3 + smu;
    lVar13 = ml + lVar12;
    if (n <= ml + lVar12) {
      lVar13 = lVar5;
    }
    dVar16 = *pdVar2;
    dVar15 = ABS(dVar16);
    lVar1 = lVar12 + 1;
    lVar8 = lVar12;
    for (lVar7 = 1; lVar7 + lVar12 <= lVar13; lVar7 = lVar7 + 1) {
      dVar4 = ABS(pdVar2[lVar7]);
      lVar9 = lVar7 + lVar12;
      if (ABS(pdVar2[lVar7]) <= dVar15) {
        dVar4 = dVar15;
        lVar9 = lVar8;
      }
      lVar8 = lVar9;
      dVar15 = dVar4;
    }
    *p = lVar8;
    dVar15 = psVar3[(lVar8 - lVar12) + smu];
    if ((dVar15 == 0.0) && (!NAN(dVar15))) break;
    if (lVar8 != lVar12) {
      psVar3[(lVar8 - lVar12) + smu] = dVar16;
      *pdVar2 = dVar15;
      dVar16 = dVar15;
    }
    for (lVar7 = 1; lVar7 + lVar12 <= lVar13; lVar7 = lVar7 + 1) {
      pdVar2[lVar7] = pdVar2[lVar7] * (-1.0 / dVar16);
    }
    lVar7 = lVar1;
    lVar9 = smu * 8;
    lVar10 = smu + lVar12;
    if (lVar5 <= smu + lVar12) {
      lVar10 = lVar5;
    }
    for (; lVar7 <= lVar10; lVar7 = lVar7 + 1) {
      psVar3 = a[lVar7];
      dVar16 = psVar3[(lVar8 - lVar7) + smu];
      if (lVar8 != lVar12) {
        psVar3[(lVar8 - lVar7) + smu] = psVar3[(lVar12 - lVar7) + smu];
        psVar3[(lVar12 - lVar7) + smu] = dVar16;
      }
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        for (lVar14 = 1; lVar14 + lVar12 <= lVar13; lVar14 = lVar14 + 1) {
          *(double *)((long)psVar3 + lVar14 * 8 + lVar9 + -8) =
               pdVar2[lVar14] * dVar16 + *(double *)((long)psVar3 + lVar14 * 8 + lVar9 + -8);
        }
      }
      lVar9 = lVar9 + -8;
    }
    p = p + 1;
    lVar12 = lVar1;
  }
  return lVar1;
}

Assistant:

sunindextype SUNDlsMat_bandGBTRF(sunrealtype** a, sunindextype n,
                                 sunindextype mu, sunindextype ml,
                                 sunindextype smu, sunindextype* p)
{
  sunindextype c, r, num_rows;
  sunindextype i, j, k, l, storage_l, storage_k, last_col_k, last_row_k;
  sunrealtype *a_c, *col_k, *diag_k, *sub_diag_k, *col_j, *kptr, *jptr;
  sunrealtype max, temp, mult, a_kj;
  sunbooleantype swap;

  /* zero out the first smu - mu rows of the rectangular array a */

  num_rows = smu - mu;
  if (num_rows > 0)
  {
    for (c = 0; c < n; c++)
    {
      a_c = a[c];
      for (r = 0; r < num_rows; r++) { a_c[r] = ZERO; }
    }
  }

  /* k = elimination step number */

  for (k = 0; k < n - 1; k++, p++)
  {
    col_k      = a[k];
    diag_k     = col_k + smu;
    sub_diag_k = diag_k + 1;
    last_row_k = SUNMIN(n - 1, k + ml);

    /* find l = pivot row number */

    l   = k;
    max = SUNRabs(*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      if (SUNRabs(*kptr) > max)
      {
        l   = i;
        max = SUNRabs(*kptr);
      }
    }
    storage_l = ROW(l, k, smu);
    *p        = l;

    /* check for zero pivot element */

    if (col_k[storage_l] == ZERO) { return (k + 1); }

    /* swap a(l,k) and a(k,k) if necessary */

    if ((swap = (l != k)))
    {
      temp             = col_k[storage_l];
      col_k[storage_l] = *diag_k;
      *diag_k          = temp;
    }

    /* Scale the elements below the diagonal in         */
    /* column k by -1.0 / a(k,k). After the above swap, */
    /* a(k,k) holds the pivot element. This scaling     */
    /* stores the pivot row multipliers -a(i,k)/a(k,k)  */
    /* in a(i,k), i=k+1, ..., SUNMIN(n-1,k+ml).            */

    mult = -ONE / (*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      (*kptr) *= mult;
    }

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., SUNMIN(n-1,k+ml) */
    /* row k is the pivot row after swapping with row l.                */
    /* The computation is done one column at a time,                    */
    /* column j=k+1, ..., SUNMIN(k+smu,n-1).                               */

    last_col_k = SUNMIN(k + smu, n - 1);
    for (j = k + 1; j <= last_col_k; j++)
    {
      col_j     = a[j];
      storage_l = ROW(l, j, smu);
      storage_k = ROW(k, j, smu);
      a_kj      = col_j[storage_l];

      /* Swap the elements a(k,j) and a(k,l) if l!=k. */

      if (swap)
      {
        col_j[storage_l] = col_j[storage_k];
        col_j[storage_k] = a_kj;
      }

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j) */
      /* a_kj = a(k,j), *kptr = - a(i,k)/a(k,k), *jptr = a(i,j) */

      if (a_kj != ZERO)
      {
        for (i = k + 1, kptr = sub_diag_k, jptr = col_j + ROW(k + 1, j, smu);
             i <= last_row_k; i++, kptr++, jptr++)
        {
          (*jptr) += a_kj * (*kptr);
        }
      }
    }
  }

  /* set the last pivot row to be n-1 and check for a zero pivot */

  *p = n - 1;
  if (a[n - 1][smu] == ZERO) { return (n); }

  /* return 0 to indicate success */

  return (0);
}